

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

GetCommitmentRequestStruct * __thiscall
cfd::js::api::json::GetCommitmentRequest::ConvertToStruct
          (GetCommitmentRequestStruct *__return_storage_ptr__,GetCommitmentRequest *this)

{
  GetCommitmentRequest *this_local;
  GetCommitmentRequestStruct *result;
  
  GetCommitmentRequestStruct::GetCommitmentRequestStruct(__return_storage_ptr__);
  __return_storage_ptr__->amount = this->amount_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->asset,(string *)&this->asset_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->asset_blind_factor,
             (string *)&this->asset_blind_factor_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->blind_factor,(string *)&this->blind_factor_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

GetCommitmentRequestStruct GetCommitmentRequest::ConvertToStruct() const {  // NOLINT
  GetCommitmentRequestStruct result;
  result.amount = amount_;
  result.asset = asset_;
  result.asset_blind_factor = asset_blind_factor_;
  result.blind_factor = blind_factor_;
  result.ignore_items = ignore_items;
  return result;
}